

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O0

int demo_choice_proc(DEMO_MENU *item,int msg,int extra)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  int iVar13;
  ulong uVar12;
  ALLEGRO_COLOR col;
  int tmp;
  int i;
  int slider_width;
  int choice_count;
  int cx;
  int dy;
  int ch;
  int cw;
  int x;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int local_a4;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int local_90;
  ALLEGRO_FONT *local_4c;
  int local_44;
  int local_38;
  int local_30;
  int local_2c;
  int local_20;
  
  local_30 = 0;
  iVar2 = screen_width / 6;
  while (*(long *)(*(long *)(in_RDI + 0x18) + (long)local_30 * 8) != 0) {
    local_30 = local_30 + 1;
  }
  if (in_ESI == 1) {
    if (local_30 == 0) {
      return 1000;
    }
    if ((*(uint *)(in_RDI + 0x10) & 2) == 0) {
      local_4c = (ALLEGRO_FONT *)al_map_rgb(0xff,0xff);
      _local_44 = _iVar13;
    }
    else {
      local_4c = (ALLEGRO_FONT *)al_map_rgb(0xff,0xff,0);
      _local_44 = _iVar13;
    }
    iVar3 = (screen_width - iVar2) / 2;
    iVar6 = _local_44;
    shadow_textprintf(local_4c,(int)demo_data[1].dat,(int)(ulong)(iVar3 - 8),(ulong)in_EDX,1,
                      *(char **)(in_RDI + 8));
    local_90 = al_get_font_line_height(demo_data[1].dat);
    local_90 = local_90 / 2;
    if (local_90 < 8) {
      local_90 = 8;
    }
    iVar4 = al_get_font_line_height(demo_data[1].dat);
    iVar4 = (iVar4 - local_90) / 2;
    fVar7 = (float)(iVar3 + shadow_offset);
    iVar5 = in_EDX + iVar4 + shadow_offset;
    fVar8 = (float)iVar5;
    fVar9 = (float)(iVar3 + shadow_offset + iVar2);
    fVar10 = (float)(iVar5 + local_90);
    uVar11 = al_map_rgb(0,0);
    uVar12 = (ulong)(uint)fVar8;
    al_draw_rectangle(fVar7,uVar12,fVar9,fVar10,uVar11,(undefined8)iVar6,0x3f800000);
    local_a4 = (iVar2 + -4) / local_30;
    if (local_a4 < 9) {
      local_a4 = 8;
    }
    local_20 = local_a4;
    local_2c = ((iVar2 + -4) * *(int *)(in_RDI + 0x14)) / local_30;
    if (iVar2 + -4 < local_2c + local_a4) {
      local_2c = (iVar2 + -4) - local_a4;
    }
    if (*(int *)(in_RDI + 0x14) == local_30 + -1) {
      local_20 = (iVar2 + -4) - local_2c;
    }
    fVar7 = (float)(iVar3 + 3 + local_2c);
    fVar8 = (float)(local_20 + 3 + iVar3 + local_2c);
    fVar9 = (float)(int)(in_EDX + iVar4 + local_90);
    uVar11 = al_map_rgb(0,0);
    al_draw_filled_rectangle(fVar7,(float)(int)(in_EDX + 3 + iVar4),fVar8,fVar9,uVar11,uVar12);
    al_draw_rectangle((float)iVar3,(float)(int)(in_EDX + iVar4),(float)(iVar3 + iVar2),
                      (float)(int)(in_EDX + iVar4 + local_90),local_4c,(undefined8)_local_44,
                      0x3f800000);
    al_draw_filled_rectangle
              ((float)(iVar3 + 2 + local_2c),(float)(int)(in_EDX + 2 + iVar4),
               (float)(local_20 + 2 + iVar3 + local_2c),(float)(int)(local_90 + -2 + in_EDX + iVar4)
               ,local_4c,(undefined8)_local_44);
    shadow_textprintf(local_4c,_local_44,(int)demo_data[1].dat,(ulong)(iVar3 + iVar2 + 8),
                      (int)(ulong)in_EDX,(char *)0x0,
                      *(undefined8 *)(*(long *)(in_RDI + 0x18) + (long)*(int *)(in_RDI + 0x14) * 8))
    ;
  }
  else if (in_ESI == 3) {
    _Var1 = key_pressed(0x52);
    if ((_Var1) && (0 < *(int *)(in_RDI + 0x14))) {
      *(int *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x14) + -1;
      play_sound_id(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                    in_stack_ffffffffffffff48,0);
      if (*(long *)(in_RDI + 0x20) != 0) {
        (**(code **)(in_RDI + 0x20))(in_RDI);
      }
    }
    _Var1 = key_pressed(0x53);
    if ((_Var1) && (*(int *)(in_RDI + 0x14) < local_30 + -1)) {
      *(int *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x14) + 1;
      play_sound_id(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                    in_stack_ffffffffffffff48,0);
      if (*(long *)(in_RDI + 0x20) != 0) {
        (**(code **)(in_RDI + 0x20))(in_RDI);
      }
    }
  }
  else if ((in_ESI == 2) && (in_EDX == 0xd)) {
    _Var1 = mouse_button_pressed(1);
    if (_Var1) {
      iVar6 = screen_width - iVar2;
      iVar3 = mouse_x();
      *(int *)(in_RDI + 0x14) = ((iVar3 - iVar6 / 2) * local_30) / iVar2;
      play_sound_id(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                    in_stack_ffffffffffffff48,0);
      if (*(long *)(in_RDI + 0x20) != 0) {
        (**(code **)(in_RDI + 0x20))(in_RDI);
      }
    }
  }
  else {
    if (in_ESI == 4) {
      local_20 = al_get_text_width(demo_data[1].dat,*(undefined8 *)(in_RDI + 8));
      local_38 = 0;
      while (*(long *)(*(long *)(in_RDI + 0x18) + (long)local_38 * 8) != 0) {
        iVar6 = al_get_text_width(demo_data[1].dat,
                                  *(undefined8 *)(*(long *)(in_RDI + 0x18) + (long)local_38 * 8));
        if (local_20 < iVar6) {
          local_20 = iVar6;
        }
        local_38 = local_38 + 1;
      }
      iVar6 = al_get_text_width(demo_data[1].dat,*(undefined8 *)(in_RDI + 8));
      if (local_20 < iVar6) {
        local_20 = al_get_text_width(demo_data[1].dat,*(undefined8 *)(in_RDI + 8));
      }
      return local_20 * 2 + iVar2 + 0x10;
    }
    if (in_ESI == 5) {
      iVar2 = demo_text_proc((DEMO_MENU *)
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                             in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
      return iVar2;
    }
  }
  return 1000;
}

Assistant:

int demo_choice_proc(DEMO_MENU * item, int msg, int extra)
{
   int x, cw, ch, dy, cx;
   int choice_count = 0;
   int slider_width = screen_width / 6;
   int i, tmp;
   ALLEGRO_COLOR col;

   /* count number of choices */
   for (; item->data[choice_count] != 0; choice_count++);

   if (msg == DEMO_MENU_MSG_DRAW) {
      if (!choice_count) return DEMO_MENU_CONTINUE;
      if (item->flags & DEMO_MENU_SELECTED) {
         col = al_map_rgb(255, 255, 0);
      } else {
         col = al_map_rgb(255, 255, 255);
      }

      /* starting position */
      x = (screen_width - slider_width) / 2;

      /* print name of the item */
      shadow_textprintf(demo_font, x - 8, extra, col, 1,
                      item->name);

      /* draw slider thingy */
      ch = al_get_font_line_height(demo_font) / 2;
      ch = MAX(8, ch);
      dy = (al_get_font_line_height(demo_font) - ch) / 2;

      /* shadow */
      al_draw_rectangle(x + shadow_offset,
           extra + dy + shadow_offset,
           x + slider_width + shadow_offset, extra + dy + ch + shadow_offset,
           al_map_rgb(0, 0, 0), 1);
      cw = (slider_width - 4) / choice_count;
      cw = MAX(cw, 8);
      cx = (slider_width - 4) * item->extra / choice_count;
      if (cx + cw > slider_width - 4) {
         cx = slider_width - 4 - cw;
      }
      if (item->extra == choice_count - 1) {
         cw = slider_width - 4 - cx;
      }
      al_draw_filled_rectangle(x + 3 + cx, extra + dy + 3,
               x + 3 + cx + cw, extra + dy + ch, al_map_rgb(0, 0, 0));

      /* slider */
      al_draw_rectangle(x, extra + dy, x + slider_width, extra + dy + ch,
           col, 1);
      al_draw_filled_rectangle(x + 2 + cx, extra + dy + 2, x + 2 + cx + cw,
               extra + dy + ch - 2, col);

      x += slider_width;

      /* print selected choice */
      shadow_textprintf(demo_font, x + 8, extra, col,
                      0, (char *)(item->data)[item->extra]);
   } else if (msg == DEMO_MENU_MSG_KEY) {
      if (key_pressed(ALLEGRO_KEY_LEFT)) {
         if (item->extra > 0) {
            --item->extra;
            play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);

            if (item->on_activate) {
               item->on_activate(item);
            }
         }
      }
            
      if (key_pressed(ALLEGRO_KEY_RIGHT)) {
         if (item->extra < choice_count - 1) {
            ++item->extra;
            play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);

            if (item->on_activate) {
               item->on_activate(item);
            }
         }
      }
   } else if (msg == DEMO_MENU_MSG_CHAR && extra == 13) {
      if (mouse_button_pressed(1)) {
         x = (screen_width - slider_width) / 2;
         item->extra = (mouse_x() - x) * choice_count / slider_width;
         play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);
         if (item->on_activate) {
            item->on_activate(item);
         }
      }
   } else if (msg == DEMO_MENU_MSG_WIDTH) {
      cw = al_get_text_width(demo_font, item->name);
      for (i = 0; item->data[i] != 0; i++) {
         tmp = al_get_text_width(demo_font, (char *)(item->data)[i]);
         if (tmp > cw) {
            cw = tmp;
         }
      }

      return MAX(al_get_text_width(demo_font, item->name),
                 cw) * 2 + slider_width + 2 * 8;
   } else if (msg == DEMO_MENU_MSG_HEIGHT) {
      return demo_text_proc(item, msg, extra);
   }

   return DEMO_MENU_CONTINUE;
}